

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O1

void lz77_advance(LZ77InternalContext *st,uchar c,int hash)

{
  WindowEntry *pWVar1;
  short sVar2;
  int iVar3;
  WindowEntry *pWVar4;
  
  iVar3 = st->winpos;
  pWVar1 = st->win + iVar3;
  if ((long)pWVar1->prev == -1) {
    if ((long)pWVar1->hashval == -1) goto LAB_00131f74;
    pWVar4 = (WindowEntry *)(st->hashtab + pWVar1->hashval);
  }
  else {
    pWVar4 = st->win + pWVar1->prev;
  }
  pWVar4->next = -1;
LAB_00131f74:
  st->win[iVar3].hashval = (short)hash;
  st->win[iVar3].prev = -1;
  sVar2 = st->hashtab[(uint)hash].first;
  pWVar1->next = sVar2;
  st->hashtab[(uint)hash].first = (short)iVar3;
  if ((long)sVar2 != -1) {
    st->win[sVar2].prev = (short)iVar3;
  }
  st->data[iVar3] = c;
  st->winpos = st->winpos + 1U & 0x7fff;
  return;
}

Assistant:

static void lz77_advance(struct LZ77InternalContext *st,
                         unsigned char c, int hash)
{
    int off;

    /*
     * Remove the hash entry at winpos from the tail of its chain,
     * or empty the chain if it's the only thing on the chain.
     */
    if (st->win[st->winpos].prev != INVALID) {
        st->win[st->win[st->winpos].prev].next = INVALID;
    } else if (st->win[st->winpos].hashval != INVALID) {
        st->hashtab[st->win[st->winpos].hashval].first = INVALID;
    }

    /*
     * Create a new entry at winpos and add it to the head of its
     * hash chain.
     */
    st->win[st->winpos].hashval = hash;
    st->win[st->winpos].prev = INVALID;
    off = st->win[st->winpos].next = st->hashtab[hash].first;
    st->hashtab[hash].first = st->winpos;
    if (off != INVALID)
        st->win[off].prev = st->winpos;
    st->data[st->winpos] = c;

    /*
     * Advance the window pointer.
     */
    st->winpos = (st->winpos + 1) & (WINSIZE - 1);
}